

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::chuzc(HEkkPrimal *this)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  double *this_00;
  HEkk *in_RDI;
  bool measure_error;
  double abs_measure_error;
  double squared_dual_infeasibility_1;
  double measure;
  double squared_dual_infeasibility;
  double hyper_sparse_measure;
  HighsInt hyper_sparse_variable_in;
  bool check_hyper_chuzc;
  vector<double,_std::allocator<double>_> *workDual;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  HEkk *in_stack_ffffffffffffffc0;
  
  this_00 = &in_RDI->callback_[0x25].data_out.objective_function_value;
  HEkk::applyTabooVariableIn
            (in_stack_ffffffffffffffc0,
             (vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),(double)in_RDI);
  if (((in_RDI->analysis_).rebuild_reason_string.field_2._M_local_buf[8] & 1U) == 0) {
    chooseColumn(this,workDual._7_1_);
  }
  else {
    if (((in_RDI->analysis_).rebuild_reason_string.field_2._M_local_buf[10] & 1U) == 0) {
      chooseColumn(this,workDual._7_1_);
    }
    iVar2 = *(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                            super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 4);
    chooseColumn(this,workDual._7_1_);
    if (-1 < iVar2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)this_00,(long)iVar2);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)this_00,(long)iVar2);
      in_stack_ffffffffffffffa8 = (vector<double,_std::allocator<double>_> *)(dVar1 * *pvVar3);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)
                 &(in_RDI->analysis_).log_options.log_dev_level,(long)iVar2);
    }
    if (-1 < *(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 4)) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)this_00,
                 (long)*(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)this_00,
                 (long)*(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)
                 &(in_RDI->analysis_).log_options.log_dev_level,
                 (long)*(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4));
    }
    *(int *)((long)&(in_RDI->analysis_).thread_factor_clocks.
                    super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                    super__Vector_impl_data._M_finish + 4) = iVar2;
  }
  HEkk::unapplyTabooVariableIn(in_RDI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void HEkkPrimal::chuzc() {
  if (done_next_chuzc) assert(use_hyper_chuzc);
  vector<double>& workDual = ekk_instance_.info_.workDual_;
  ekk_instance_.applyTabooVariableIn(workDual, 0);
  if (use_hyper_chuzc) {
    // Perform hyper-sparse CHUZC and then check result using full CHUZC
    if (!done_next_chuzc) chooseColumn(true);
    const bool check_hyper_chuzc = true;
    if (check_hyper_chuzc) {
      HighsInt hyper_sparse_variable_in = variable_in;
      chooseColumn(false);
      double hyper_sparse_measure = 0;
      if (hyper_sparse_variable_in >= 0) {
        double squared_dual_infeasibility = workDual[hyper_sparse_variable_in] *
                                            workDual[hyper_sparse_variable_in];
        hyper_sparse_measure =
            squared_dual_infeasibility / edge_weight_[hyper_sparse_variable_in];
      }
      double measure = 0;
      if (variable_in >= 0) {
        double squared_dual_infeasibility =
            workDual[variable_in] * workDual[variable_in];
        measure = squared_dual_infeasibility / edge_weight_[variable_in];
      }
      double abs_measure_error = fabs(hyper_sparse_measure - measure);
      bool measure_error = abs_measure_error > 1e-12;
      // if (measure_error)
      //   printf("Iteration %" HIGHSINT_FORMAT
      //          ": Hyper-sparse CHUZC measure %g != %g = Full "
      //          "CHUZC measure (%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT
      //          "): error %g\n",
      //          ekk_instance_.iteration_count_, hyper_sparse_measure, measure,
      //          hyper_sparse_variable_in, variable_in, abs_measure_error);

      // todo this fails on some rarer occasions, e.g. on glass4
      assert(!measure_error);
      variable_in = hyper_sparse_variable_in;
    }
  } else {
    chooseColumn(false);
  }
  ekk_instance_.unapplyTabooVariableIn(workDual);
}